

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.cpp
# Opt level: O3

void CIF::makeSuperCell(Reader *cif,Vector3d *uvw,Vector3d *abc,Vector3d *widths,Vector3d *tilts,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *A,vector<double,_std::allocator<double>_> *x,
                       vector<double,_std::allocator<double>_> *y,
                       vector<double,_std::allocator<double>_> *z,
                       vector<double,_std::allocator<double>_> *occ,
                       vector<double,_std::allocator<double>_> *ux,
                       vector<double,_std::allocator<double>_> *uy,
                       vector<double,_std::allocator<double>_> *uz)

{
  double *pdVar1;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *__x;
  pointer pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer pMVar5;
  pointer pbVar6;
  pointer pAVar7;
  int iVar8;
  long lVar9;
  runtime_error *prVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  pointer pAVar14;
  size_type __new_size;
  pointer pMVar15;
  ulong uVar16;
  pointer pbVar17;
  int iVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar22 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  initializer_list<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> __l;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  basis;
  Vector3i mins;
  vector<double,_std::allocator<double>_> pos;
  AtomSite at;
  Matrix3d x_rotation;
  Matrix3d za_rotation;
  CellGeometry geom;
  UnitCell cell;
  Matrix3d z_rotation;
  Matrix3d y_rotation;
  ulong local_5d8;
  ulong local_5d0;
  int local_5c8;
  Vector3i local_5c4;
  pointer local_5b8;
  undefined8 uStack_5b0;
  pointer local_5a8;
  pointer pdStack_5a0;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_590;
  pointer local_578;
  pointer pMStack_570;
  pointer local_568;
  pointer pMStack_560;
  undefined1 local_558 [24];
  Vector3d *local_540;
  Vector3i local_534;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_528;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_510;
  int local_508;
  int local_504;
  vector<double,_std::allocator<double>_> local_500;
  AtomSite local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> local_450;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [24];
  AtomSite *local_400;
  AtomSite *local_3f8;
  pointer local_3f0;
  pointer local_3e8;
  pointer local_3e0;
  undefined1 local_3d8 [16];
  double local_3c8;
  double local_3c0;
  double dStack_3b8;
  double local_3b0;
  double dStack_3a8;
  double dStack_3a0;
  double local_398;
  Matrix3d local_388;
  undefined1 local_338 [16];
  double local_328;
  undefined8 uStack_320;
  double local_318;
  undefined8 uStack_310;
  double local_308;
  undefined8 uStack_300;
  double local_2f8;
  undefined8 uStack_2f0;
  CellGeometry local_2e0;
  undefined1 local_268 [16];
  UnitCell local_258;
  Matrix3d local_1c8;
  Matrix3d local_178;
  Vector3d local_128;
  Vector3d local_108;
  Vector3d local_e8;
  Vector3d local_c8;
  Vector3d local_a8;
  Vector3d local_88;
  Vector3d local_68;
  Vector3d local_48;
  
  local_418._8_8_ = local_418._0_8_;
  local_540 = widths;
  local_510 = A;
  Reader::getUnitCell(&local_258,cif);
  UnitCell::getCellGeometry(&local_2e0,&local_258);
  std::vector<double,_std::allocator<double>_>::vector(&local_4e8.occupancy,&local_2e0.avec);
  local_5a8 = (pointer)*local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
  pdStack_5a0 = (pointer)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[1];
  pdVar2 = (pointer)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[2];
  operator_delete(local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::vector(&local_4e8.occupancy,&local_2e0.bvec);
  local_568 = (pointer)*local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
  pMStack_560 = (pointer)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[1];
  local_5b8 = (pointer)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[2];
  uStack_5b0 = 0;
  operator_delete(local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::vector(&local_4e8.occupancy,&local_2e0.cvec);
  local_578 = (pointer)*local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
  pMStack_570 = (pointer)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[1];
  local_558._8_8_ = 0;
  local_558._0_8_ =
       local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  operator_delete(local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_5a8;
  local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdStack_5a0;
  local_4e8.thermal_u.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_568;
  local_4e8.thermal_u.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMStack_560;
  local_4e8.thermal_u.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_5b8;
  local_4e8.positions.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_578;
  local_4e8.positions.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pMStack_570;
  local_4e8.positions.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_558._0_8_;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_4e8;
  local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar2;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_590,__l,(allocator_type *)&local_388);
  dVar25 = (uvw->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar34 = (uvw->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar23 = (uvw->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       dVar23 * (double)local_578 + dVar34 * (double)local_568 + dVar25 * (double)local_5a8;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       dVar23 * (double)pMStack_570 + dVar34 * (double)pMStack_560 + dVar25 * (double)pdStack_5a0;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)local_558._0_8_ * dVar23 + dVar25 * (double)pdVar2 + (double)local_5b8 * dVar34;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1.0;
  Utilities::generateNormalisedRotationMatrix<double>(&local_388,&local_68,&local_88);
  auVar20._8_8_ =
       -(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[5]);
  auVar20._0_8_ =
       -(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[4]);
  auVar21._8_4_ =
       (int)-(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[7]);
  auVar21._0_8_ =
       -(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[6]);
  auVar21._12_4_ =
       (int)(-(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[7]) >> 0x20);
  auVar21 = packssdw(auVar20,auVar21);
  auVar26._8_8_ =
       -(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1]);
  auVar26._0_8_ =
       -(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0]);
  auVar27._8_4_ =
       (int)-(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[3]);
  auVar27._0_8_ =
       -(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2]);
  auVar27._12_4_ =
       (int)(-(ulong)NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[3]) >> 0x20);
  auVar27 = packssdw(auVar26,auVar27);
  auVar21 = packssdw(auVar27,auVar21);
  if (((((((((((((((((auVar21 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar21 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar21 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar21 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar21 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar21 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar21 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar21 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar21 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar21 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar21 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar21 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar21[0xf] < '\0')
     || (NAN(local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8]))) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Zone axis rotation matrix contains NaNs");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar25 = (abc->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar34 = (abc->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  if ((((dVar25 == 0.0) && (!NAN(dVar25))) && (dVar34 == 0.0)) && (!NAN(dVar34))) {
    dVar23 = (abc->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
    if ((dVar23 == 0.0) && (!NAN(dVar23))) {
      local_568 = (pointer)(pointer)0x3ff0000000000000;
      pMStack_560 = (pointer)(pointer)0x0;
      local_558._0_8_ = (pointer)0x0;
      local_558._8_8_ = (pointer)0x0;
      local_428._0_8_ = (pointer)0x3ff0000000000000;
      local_438._0_8_ = (pointer)0x0;
      local_578 = (pointer)0x0;
      pMStack_570 = (pointer)0x3ff0000000000000;
      local_5b8 = (pointer)0x0;
      goto LAB_00132192;
    }
  }
  dVar23 = (abc->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  auVar29._0_8_ =
       (double)local_578 * dVar23 + (double)local_568 * dVar34 + (double)local_5a8 * dVar25;
  dVar35 = (double)pMStack_570 * dVar23 +
           (double)pMStack_560 * dVar34 + (double)pdStack_5a0 * dVar25;
  dVar34 = (double)local_5b8 * dVar34 + (double)pdVar2 * dVar25 + (double)local_558._0_8_ * dVar23;
  dVar25 = dVar34 * local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[6] +
           dVar35 * local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[3] +
           auVar29._0_8_ *
           local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
  dVar34 = dVar34 * local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[7] +
           dVar35 * local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[4] +
           auVar29._0_8_ *
           local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
  local_3d8._8_4_ = SUB84(dVar34,0);
  local_3d8._0_8_ = dVar25;
  local_3d8._12_4_ = (int)((ulong)dVar34 >> 0x20);
  local_3c8 = 0.0;
  if (ABS(dVar25) < 1e-15) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_3d8._8_8_;
    local_3d8 = auVar4 << 0x40;
  }
  if (ABS(dVar34) < 1e-15) {
    local_3d8._8_8_ = 0;
  }
  dVar34 = local_3d8._0_8_;
  dVar23 = local_3d8._8_8_;
  dVar25 = dVar23 * dVar23;
  auVar29._0_8_ = dVar25 + dVar34 * dVar34;
  auVar29._8_8_ = dVar25 + dVar25;
  if (auVar29._0_8_ <= 0.0) {
    dVar25 = -0.0;
    auVar21 = local_3d8;
  }
  else {
    auVar28._8_8_ = 0;
    auVar28._0_8_ = auVar29._0_8_;
    auVar21 = sqrtpd(auVar29,auVar28);
    auVar30._0_8_ = auVar21._0_8_;
    dVar25 = -0.0 / auVar30._0_8_;
    auVar30._8_8_ = auVar30._0_8_;
    auVar21 = divpd(local_3d8,auVar30);
    auVar29._0_8_ = auVar21._8_8_ * auVar21._8_8_ + auVar21._0_8_ * auVar21._0_8_;
  }
  dVar35 = auVar21._0_8_ + 1.0;
  dVar24 = auVar21._8_8_ + 0.0;
  auVar29._0_8_ = dVar25 * dVar25 + auVar29._0_8_;
  if (1.0 <= auVar29._0_8_) {
    auVar29._0_8_ = 1.0;
  }
  if ((0.0 - dVar25) * (0.0 - dVar25) + dVar24 * dVar24 + dVar35 * dVar35 <= auVar29._0_8_ * 1e-24)
  {
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 1.0;
    Utilities::generateRotationMatrix<double>((Matrix3d *)&local_4e8,&local_a8,3.141592653589793);
    local_568 = (pointer)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
    pMStack_560 = (pointer)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
    local_558._0_8_ =
         local_4e8.positions.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_558._8_8_ =
         local_4e8.positions.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_428._0_8_ =
         local_4e8.positions.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_438._0_8_ =
         local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_578 = local_4e8.thermal_u.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pMStack_570 = local_4e8.thermal_u.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_5b8 = local_4e8.thermal_u.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 1.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = dVar34;
    local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = dVar23;
    Utilities::generateNormalisedRotationMatrix<double>((Matrix3d *)&local_4e8,&local_c8,&local_e8);
    local_568 = (pointer)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
    pMStack_560 = (pointer)local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
    local_558._0_8_ =
         local_4e8.positions.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_558._8_8_ =
         local_4e8.positions.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_428._0_8_ =
         local_4e8.positions.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_438._0_8_ =
         local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_578 = local_4e8.thermal_u.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pMStack_570 = local_4e8.thermal_u.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_5b8 = local_4e8.thermal_u.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
LAB_00132192:
  local_438._8_8_ = 0;
  uStack_5b0 = 0;
  auVar31._8_8_ = -(ulong)NAN((double)local_558._8_8_);
  auVar31._0_8_ = -(ulong)NAN((double)local_558._0_8_);
  auVar22._8_8_ = -(ulong)NAN((double)pMStack_570);
  auVar22._0_8_ = -(ulong)NAN((double)local_5b8);
  auVar21 = packssdw(auVar22,auVar31);
  auVar32._8_8_ = -(ulong)NAN((double)pMStack_560);
  auVar32._0_8_ = -(ulong)NAN((double)local_568);
  auVar3._8_4_ = (int)-(ulong)NAN((double)local_438._0_8_);
  auVar3._0_8_ = -(ulong)NAN((double)local_578);
  auVar3._12_4_ = (int)(-(ulong)NAN((double)local_438._0_8_) >> 0x20);
  auVar27 = packssdw(auVar32,auVar3);
  auVar21 = packssdw(auVar27,auVar21);
  if (((((((((((((((((auVar21 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar21 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar21 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar21 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar21 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar21 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar21 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar21 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar21 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar21 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar21 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar21 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar21[0xf] < '\0')
     || (NAN((double)local_428._0_8_))) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Normal rotation matrix contains NaNs");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_428._8_8_ = 0;
  local_5a8 = (pointer)(tilts->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array[1];
  local_418._0_8_ =
       (tilts->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       [2] * 3.141592653589793;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  Utilities::generateRotationMatrix<double>
            ((Matrix3d *)local_3d8,&local_48,
             ((tilts->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
              .array[0] * 3.141592653589793) / 180.0);
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       1.0;
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  Utilities::generateRotationMatrix<double>
            (&local_178,&local_108,((double)local_5a8 * 3.141592653589793) / 180.0);
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1.0;
  Utilities::generateRotationMatrix<double>(&local_1c8,&local_128,(double)local_418._0_8_ / 180.0);
  if (local_590.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_590.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar13 = 0;
    do {
      dVar25 = *(double *)
                ((long)((local_590.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar9);
      pdVar1 = (double *)
               ((long)((local_590.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar9 + 8);
      dVar34 = *pdVar1;
      dVar23 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_590.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar9);
      *pdVar1 = dVar23 * local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6] +
                local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] * dVar34 +
                dVar25 * local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[0];
      pdVar1[1] = dVar23 * local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[7] +
                  local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[4] * dVar34 +
                  dVar25 * local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1];
      *(double *)
       ((long)((local_590.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar9 + 0x10) =
           local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] * dVar23 +
           local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] * dVar34 +
           dVar25 * local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[2];
      dVar25 = *(double *)
                ((long)((local_590.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar9);
      pdVar1 = (double *)
               ((long)((local_590.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar9 + 8);
      dVar34 = *pdVar1;
      dVar23 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_590.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar9);
      *pdVar1 = (double)local_558._0_8_ * dVar23 +
                dVar34 * (double)local_578 + dVar25 * (double)local_568;
      pdVar1[1] = (double)local_558._8_8_ * dVar23 +
                  dVar34 * (double)pMStack_570 + dVar25 * (double)pMStack_560;
      *(double *)
       ((long)((local_590.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar9 + 0x10) =
           dVar23 * (double)local_428._0_8_ + dVar34 * (double)local_5b8 +
           dVar25 * (double)local_438._0_8_;
      dVar25 = *(double *)
                ((long)((local_590.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar9);
      pdVar1 = (double *)
               ((long)((local_590.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar9 + 8);
      dVar34 = *pdVar1;
      dVar23 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_590.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar9);
      *pdVar1 = dVar23 * dStack_3a8 + local_3c0 * dVar34 + dVar25 * (double)local_3d8._0_8_;
      pdVar1[1] = dVar23 * dStack_3a0 + dStack_3b8 * dVar34 + dVar25 * (double)local_3d8._8_8_;
      *(double *)
       ((long)((local_590.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar9 + 0x10) = local_398 * dVar23 + local_3b0 * dVar34 + dVar25 * local_3c8;
      dVar25 = *(double *)
                ((long)((local_590.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar9);
      pdVar1 = (double *)
               ((long)((local_590.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar9 + 8);
      dVar34 = *pdVar1;
      dVar23 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_590.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar9);
      *pdVar1 = dVar23 * local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6] +
                local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] * dVar34 +
                dVar25 * local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[0];
      pdVar1[1] = dVar23 * local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[7] +
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[4] * dVar34 +
                  dVar25 * local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1];
      *(double *)
       ((long)((local_590.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar9 + 0x10) =
           local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] * dVar23 +
           local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] * dVar34 +
           dVar25 * local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[2];
      dVar25 = *(double *)
                ((long)((local_590.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar9);
      pdVar1 = (double *)
               ((long)((local_590.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar9 + 8);
      dVar34 = *pdVar1;
      dVar23 = pdVar1[1];
      auVar33._0_8_ =
           dVar23 * local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[6] +
           local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] * dVar34 +
           dVar25 * local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0];
      auVar33._8_8_ =
           dVar23 * local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[7] +
           local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] * dVar34 +
           dVar25 * local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1];
      *(undefined1 (*) [16])
       ((long)((local_590.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar9) = auVar33;
      *(double *)
       ((long)((local_590.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar9 + 0x10) =
           local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] * dVar23 +
           local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] * dVar34 +
           dVar25 * local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[2];
      uVar13 = uVar13 + 1;
      uVar16 = ((long)local_590.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_590.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar9 = lVar9 + 0x18;
    } while (uVar13 <= uVar16 && uVar16 - uVar13 != 0);
  }
  calculateTiling(&local_590,
                  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[0],
                  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[1],
                  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[2],&local_534,&local_5c4);
  local_5a8 = (pointer)CONCAT44(local_5a8._4_4_,
                                local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0]);
  local_5b8 = (pointer)CONCAT44(local_5b8._4_4_,
                                local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[1]);
  local_438._0_4_ =
       local_534.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  local_578 = (pointer)CONCAT44(local_578._4_4_,
                                local_534.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[1]);
  local_568 = (pointer)CONCAT44(local_568._4_4_,
                                local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[2]);
  local_558._0_4_ =
       local_534.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
  ;
  std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::vector(&local_450,&local_258.atoms);
  pAVar7 = local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar18 = 0;
  }
  else {
    iVar18 = 0;
    pAVar14 = local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      AtomSite::AtomSite(&local_4e8,pAVar14);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_468,&local_4e8.element);
      pbVar6 = local_468.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar17 = local_468.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&local_500,&local_4e8.positions);
      uVar13 = (long)local_500.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_500.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_500);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_468);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4e8.label);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4e8.element);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_4e8.positions);
      if (local_4e8.thermal_u.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4e8.thermal_u.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4e8.thermal_u.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4e8.thermal_u.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_4e8.occupancy.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4e8.occupancy.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar18 = iVar18 + (int)((ulong)((long)pbVar6 - (long)pbVar17) >> 5) * (int)(uVar13 >> 3) *
                        -0x55555555;
      pAVar14 = pAVar14 + 1;
    } while (pAVar14 != pAVar7);
  }
  std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::~vector(&local_450);
  if ((((int)local_5a8 == local_438._0_4_) || ((int)local_5b8 == (int)local_578)) ||
     ((int)local_568 == local_558._0_4_)) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Did not find any atoms inside limits");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __new_size = (size_type)
               (((int)local_568 - local_558._0_4_) * ((int)local_5b8 - (int)local_578) *
               ((int)local_5a8 - local_438._0_4_) * iVar18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(local_510,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(x,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(y,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(z,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(occ,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(ux,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(uy,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(uz,__new_size);
  std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::vector(&local_450,&local_258.atoms);
  local_5d8 = 0;
  local_400 = local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_3f8 = local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      AtomSite::AtomSite(&local_4e8,
                         local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&local_468,&local_4e8.positions);
      local_3e8 = local_468.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pbVar17 = local_468.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_468.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_468.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_500,(vector<double,_std::allocator<double>_> *)pbVar17);
          pMVar5 = local_590.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_5c8 = local_534.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2];
          if (local_534.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] <
              local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2]) {
            local_328 = *local_500.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            local_338 = *(undefined1 (*) [16])
                         (local_500.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
            local_578 = local_338._8_8_;
            uStack_320 = 0;
            local_428._8_4_ = SUB84(local_328,0);
            local_428._0_8_ = local_328;
            local_428._12_4_ = (int)((ulong)local_328 >> 0x20);
            local_268._8_4_ = local_338._0_4_;
            local_268._0_8_ = local_338._0_8_;
            local_268._12_4_ = local_338._4_4_;
            iVar18 = local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[2];
            iVar8 = local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1];
            pMStack_570 = local_578;
            local_3f0 = pbVar17;
            do {
              if (local_534.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] < iVar8) {
                local_318 = (double)local_5c8;
                uStack_310 = 0;
                local_418._8_4_ = SUB84(local_318,0);
                local_418._0_8_ = local_318;
                local_418._12_4_ = (int)((ulong)local_318 >> 0x20);
                local_3e0 = local_590.
                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                pMVar15 = local_590.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar12 = local_534.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[1];
                iVar11 = local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0];
                do {
                  if (local_534.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[0] < iVar11) {
                    local_5b8 = local_590.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    local_308 = (double)iVar12;
                    uStack_300 = 0;
                    local_438._8_4_ = SUB84(local_308,0);
                    local_438._0_8_ = local_308;
                    local_438._12_4_ = (int)((ulong)local_308 >> 0x20);
                    iVar18 = local_534.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[0];
                    local_508 = iVar12;
                    do {
                      local_5a8 = local_590.
                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      local_2f8 = (double)iVar18;
                      uStack_2f0 = 0;
                      local_558._8_4_ = SUB84(local_2f8,0);
                      local_558._0_8_ = local_2f8;
                      local_558._12_4_ = (int)((ulong)local_2f8 >> 0x20);
                      lVar9 = 0;
                      local_568 = (pointer)0x0;
                      local_5d0 = 0;
                      local_504 = iVar18;
                      while( true ) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_528,&local_4e8.element);
                        lVar19 = (long)local_528.
                                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_528.
                                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_528);
                        if ((ulong)(lVar19 >> 5) <= local_5d0) break;
                        dVar25 = pMVar15[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * (double)local_418._0_8_ +
                                 local_5b8[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * (double)local_438._0_8_ +
                                 (local_5a8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[0] * (double)local_558._0_8_ +
                                 pMVar5[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * (double)local_578 +
                                 pMVar5[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * (double)local_268._0_8_ +
                                 (pMVar5->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[0] * (double)local_428._0_8_;
                        dVar34 = pMVar15[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * (double)local_418._8_8_ +
                                 local_5b8[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * (double)local_438._8_8_ +
                                 (local_5a8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[1] * (double)local_558._8_8_ +
                                 pMVar5[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * (double)pMStack_570 +
                                 pMVar5[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * (double)local_268._8_8_ +
                                 (pMVar5->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[1] * (double)local_428._8_8_;
                        if (((0.0 <= dVar25) &&
                            (dVar25 <= (local_540->
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                       .m_storage.m_data.array[0])) &&
                           ((0.0 <= dVar34 &&
                            (dVar34 <= (local_540->
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                       .m_storage.m_data.array[1])))) {
                          dVar25 = pMVar15[2].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2] * local_318 +
                                   local_5b8[1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2] * local_308 +
                                   (local_5a8->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[2] * local_2f8 +
                                   pMVar5[2].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2] * (double)local_338._8_8_ +
                                   (pMVar5->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[2] * local_328 +
                                   pMVar5[1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2] * (double)local_338._0_8_;
                          if ((0.0 <= dVar25) &&
                             (dVar25 <= (local_540->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        ).m_storage.m_data.array[2])) {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_528,&local_4e8.element);
                            iVar18 = (int)local_5d8;
                            std::__cxx11::string::_M_assign
                                      ((string *)
                                       ((local_510->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + iVar18));
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_528);
                            dVar25 = local_338._0_8_;
                            (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar18] =
                                 pMVar15[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * local_318 +
                                 local_5b8[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * local_308 +
                                 (local_5a8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[0] * local_2f8 +
                                 pMVar5[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * local_338._8_8_ +
                                 (pMVar5->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[0] * local_328 +
                                 pMVar5[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * dVar25;
                            (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar18] =
                                 pMVar15[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * local_318 +
                                 local_5b8[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * local_308 +
                                 (local_5a8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[1] * local_2f8 +
                                 pMVar5[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * (double)local_578 +
                                 pMVar5[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * dVar25 +
                                 (pMVar5->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[1] * local_328;
                            (z->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar18] =
                                 pMVar15[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] * local_318 +
                                 local_5b8[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] * local_308 +
                                 (local_5a8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[2] * local_2f8 +
                                 pMVar5[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] * (double)local_578 +
                                 pMVar5[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] * dVar25 +
                                 (pMVar5->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[2] * local_328;
                            std::vector<double,_std::allocator<double>_>::vector
                                      ((vector<double,_std::allocator<double>_> *)&local_528,
                                       &local_4e8.occupancy);
                            (occ->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar18] =
                                 ((local_528.
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[local_5d0];
                            operator_delete(local_528.
                                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_528.
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_528.
                                                                                                        
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            __x = &local_4e8.thermal_u;
                            std::
                            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ::vector(&local_528,__x);
                            (ux->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar18] =
                                 *(double *)
                                  ((long)((local_528.
                                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data.array + lVar9);
                            operator_delete(local_528.
                                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_528.
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_528.
                                                                                                        
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            std::
                            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ::vector(&local_528,__x);
                            (uy->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar18] =
                                 *(double *)
                                  ((long)((local_528.
                                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data.array + lVar9 + 8);
                            operator_delete(local_528.
                                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_528.
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_528.
                                                                                                        
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            std::
                            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ::vector(&local_528,__x);
                            (uz->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar18] =
                                 *(double *)
                                  ((long)((local_528.
                                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data.array + lVar9 + 0x10);
                            operator_delete(local_528.
                                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_528.
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_528.
                                                                                                        
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            local_5d8 = (ulong)(iVar18 + 1);
                            pMVar15 = local_3e0;
                          }
                        }
                        local_5d0 = local_5d0 + 1;
                        local_568 = (pointer)((long)local_568 + 0x20);
                        lVar9 = lVar9 + 0x18;
                      }
                      iVar18 = local_504 + 1;
                      iVar8 = local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[1];
                      iVar12 = local_508;
                      iVar11 = local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[0];
                    } while (iVar18 < local_5c4.
                                      super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array[0]);
                  }
                  iVar12 = iVar12 + 1;
                  iVar18 = local_5c4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2];
                } while (iVar12 < iVar8);
              }
              local_5c8 = local_5c8 + 1;
            } while (local_5c8 < iVar18);
            pbVar17 = local_3f0;
            if (local_500.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) goto LAB_00132ee6;
          }
          else {
LAB_00132ee6:
            operator_delete(local_500.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_500.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_500.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pbVar17 = (pointer)((pbVar17->field_2)._M_local_buf + 8);
        } while (pbVar17 != local_3e8);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_468);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4e8.label);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4e8.element);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_4e8.positions);
      if (local_4e8.thermal_u.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4e8.thermal_u.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4e8.thermal_u.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4e8.thermal_u.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4e8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_4e8.occupancy.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4e8.occupancy.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
      super__Vector_impl_data._M_start = local_3f8 + 1;
    } while (local_450.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
             super__Vector_impl_data._M_start != local_400);
    local_5d8 = (ulong)(int)local_5d8;
  }
  std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::~vector(&local_450);
  if ((((x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_start !=
        (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish) &&
      ((y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_start !=
       (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish)) &&
     ((z->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start !=
      (z->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(local_510,local_5d8);
    std::vector<double,_std::allocator<double>_>::resize(x,local_5d8);
    std::vector<double,_std::allocator<double>_>::resize(y,local_5d8);
    std::vector<double,_std::allocator<double>_>::resize(z,local_5d8);
    std::vector<double,_std::allocator<double>_>::resize(occ,local_5d8);
    std::vector<double,_std::allocator<double>_>::resize(ux,local_5d8);
    std::vector<double,_std::allocator<double>_>::resize(uy,local_5d8);
    std::vector<double,_std::allocator<double>_>::resize(uz,local_5d8);
    if (local_590.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_590.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_590.
                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_590.
                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2e0.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e0.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e0.cvec.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e0.cvec.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2e0.bvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e0.bvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e0.bvec.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e0.bvec.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2e0.avec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e0.avec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e0.avec.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e0.avec.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::~vector(&local_258.atoms);
    if (local_258.geometry.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.geometry.cvec.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.geometry.cvec.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.geometry.cvec.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_258.geometry.bvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.geometry.bvec.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.geometry.bvec.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.geometry.bvec.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_258.geometry.avec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.geometry.avec.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.geometry.avec.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.geometry.avec.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"Did not find any atoms inside limits");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void makeSuperCell(Reader cif, Eigen::Vector3d uvw, Eigen::Vector3d abc, Eigen::Vector3d widths,
                       Eigen::Vector3d tilts, std::vector<std::string> &A, std::vector<double> &x, std::vector<double> &y,
                       std::vector<double> &z, std::vector<double> &occ, std::vector<double> &ux, std::vector<double> &uy,
                       std::vector<double> &uz) {
        // TODO: check that the uvw and abc vectors are no colinear
        UnitCell cell = cif.getUnitCell();

        auto geom = cell.getCellGeometry();
        auto a_vector = Eigen::Vector3d(geom.getAVector().data());
        auto b_vector = Eigen::Vector3d(geom.getBVector().data());
        auto c_vector = Eigen::Vector3d(geom.getCVector().data());

        // TODO: try to use more eigen matrices/vectors instead of stl
//    Eigen::Matrix3d basis;
//    basis << // use std::Vectors here?

        // for easy loopage
        // TODO: make this an eigen vector of eigen vectors
        std::vector<Eigen::Vector3d> basis = {a_vector, b_vector, c_vector};

        // this gives us the element type, occupancy and FRACTIONAL coords as well as the basis vectors
        // now we just need rotate them and tile them to fill the space

        // create vector from the zone axis we want
        Eigen::Vector3d uvw_vec = uvw(0) * a_vector + uvw(1) * b_vector + uvw(2) * c_vector;
        // create matrix with direction we want to map onto (here is is the z direction)
        Eigen::Vector3d z_direction(0.0, 0.0, 1.0);
        // create the rotation matrix
        auto za_rotation = Utilities::generateNormalisedRotationMatrix<double>(uvw_vec, z_direction);

        if (za_rotation.array().isNaN().sum() != 0) {
            throw std::runtime_error("Zone axis rotation matrix contains NaNs");
        }

        // similarly for rotation in x,y plane, though here we default to 0 rotation
        Eigen::Matrix3d xy_rotation = Eigen::Matrix3d::Identity();
        if ((abc.array() != 0).any()) {
            Eigen::Vector3d abc_vec = abc(0) * a_vector + abc(1) * b_vector + abc(2) * c_vector;
            abc_vec = za_rotation * abc_vec;
            abc_vec(2) = 0.0; // no rotate the z-axis!
            if (std::fabs(abc_vec(0)) < 1e-15)
                abc_vec(0) = 0.0;
            if (std::fabs(abc_vec(1)) < 1e-15)
                abc_vec(1) = 0.0;
            Eigen::Vector3d x_direction(1.0, 0.0, 0.0); // TODO: use << initialisation
            // Need the negative angle here? so give inputs in opposite order?
            if (x_direction.isApprox(-1 * abc_vec.normalized())) // note normalized() return a copy (that is normalized...)
                // Vectors are opposite, generate 180 rotation about z
                xy_rotation = Utilities::generateRotationMatrix<double>(z_direction, CIF::Utilities::pi);
            else
                // Generate rotation (returns correctly if vectors are in the same direction)
                xy_rotation = Utilities::generateNormalisedRotationMatrix<double>(x_direction, abc_vec);
        }

        if (xy_rotation.array().isNaN().sum() != 0) {
            throw std::runtime_error("Normal rotation matrix contains NaNs");
        }

        // convert angles to radians
        double alpha = tilts(0) * CIF::Utilities::pi / 180;
        double beta = tilts(1) * CIF::Utilities::pi / 180;
        double gamma = tilts(2) * CIF::Utilities::pi / 180;

        // generate the small rotation matrices
        auto x_rotation = Utilities::generateRotationMatrix<double>({1.0, 0.0, 0.0}, alpha);
        auto y_rotation = Utilities::generateRotationMatrix<double>({0.0, 1.0, 0.0}, beta);
        auto z_rotation = Utilities::generateRotationMatrix<double>({0.0, 0.0, 1.0}, gamma);

        for (int i = 0; i < basis.size(); ++i) {
            basis[i] = za_rotation * basis[i];
            basis[i] = xy_rotation * basis[i];
            basis[i] = x_rotation * basis[i];
            basis[i] = y_rotation * basis[i];
            basis[i] = z_rotation * basis[i];
        }

        Eigen::Vector3i mins, maxs;
        calculateTiling(basis, widths(0), widths(1), widths(2), mins, maxs);
        Eigen::Vector3i range = maxs - mins;

        // get total number of atoms in our xyz file
        int count = 0;
        for (auto at : cell.getAtoms())
            count += at.getElements().size() * at.getPositions().size();
        count = count * range(0) * range(1) * range(2);

        if ((range.array() == 0).any())
            throw std::runtime_error("Did not find any atoms inside limits");

        A.resize(count);
        x.resize(count);
        y.resize(count);
        z.resize(count);
        occ.resize(count);
        ux.resize(count);
        uy.resize(count);
        uz.resize(count);

        int it = 0;

        for (auto at : cell.getAtoms()) {
            for (auto pos : at.getPositions()) {
                // convert from fractional coordinates
                auto p = pos[0] * basis[0] + pos[1] * basis[1] + pos[2] * basis[2];

                for (int k = mins(2); k < maxs(2); ++k) {
                    auto k_factor = basis[2] * k;

                    for (int j = mins(1); j < maxs(1); ++j) {
                        auto j_factor = basis[1] * j;

                        for (int i = mins(0); i < maxs(0); ++i) {
                            auto i_factor = basis[0] * i;

                            auto new_pos = p + i_factor + j_factor + k_factor;

                            for (int ind = 0; ind < at.getElements().size(); ++ind) {

                                if (testInRange(new_pos, 0.0, widths(0), 0.0, widths(1), 0.0, widths(2))) {
                                    A[it] = at.getElements()[ind];
                                    x[it] = new_pos(0);
                                    y[it] = new_pos(1);
                                    z[it] = new_pos(2);
                                    occ[it] = at.getOccupancies()[ind];
                                    ux[it] = at.getThermals()[ind](0);
                                    uy[it] = at.getThermals()[ind](1);
                                    uz[it] = at.getThermals()[ind](2);

                                    ++it;
                                }
                            }
                        }
                    }
                }
            }
        }

        if (x.empty() || y.empty() || z.empty())
            throw std::runtime_error("Did not find any atoms inside limits");

        // resize back down to our valid entries
        A.resize(it);
        x.resize(it);
        y.resize(it);
        z.resize(it);
        occ.resize(it);
        ux.resize(it);
        uy.resize(it);
        uz.resize(it);
    }